

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O0

ktx_error_code_e ktxTexture2_CreateCopy(ktxTexture2 *orig,ktxTexture2 **newTex)

{
  void *__ptr;
  ktxTexture2 *in_RSI;
  ktxTexture2 *tex;
  ktx_error_code_e result;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if (in_RSI == (ktxTexture2 *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    __ptr = malloc(0xa8);
    if (__ptr == (void *)0x0) {
      local_4 = KTX_OUT_OF_MEMORY;
    }
    else {
      local_4 = ktxTexture2_constructCopy
                          (in_RSI,(ktxTexture2 *)
                                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (local_4 == KTX_SUCCESS) {
        *(void **)in_RSI = __ptr;
      }
      else {
        free(__ptr);
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
 ktxTexture2_CreateCopy(ktxTexture2* orig, ktxTexture2** newTex)
 {
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructCopy(tex, orig);
    if (result != KTX_SUCCESS) {
        free(tex);
    } else {
        *newTex = tex;
    }
    return result;

 }